

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_print_(lyout *out,lyd_node *root,LYD_FORMAT format,int options)

{
  int iVar1;
  LY_ERR *pLVar2;
  
  if (root == (lyd_node *)0x0) {
    iVar1 = 0;
    if ((out->type & ~LYOUT_STREAM) == LYOUT_MEMORY) {
      iVar1 = 0;
      ly_print(out,"");
    }
  }
  else {
    if (format == LYD_JSON) {
      iVar1 = json_print_data(out,root,options);
      return iVar1;
    }
    if (format == LYD_XML) {
      iVar1 = xml_print_data(out,root,options);
      return iVar1;
    }
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    ly_log(LY_LLERR,"Unknown output format.");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
lyd_print_(struct lyout *out, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    if (!root) {
        /* no data to print, but even empty tree is valid */
        if (out->type == LYOUT_MEMORY || out->type == LYOUT_CALLBACK) {
            ly_print(out, "");
        }
        return EXIT_SUCCESS;
    }

    switch (format) {
    case LYD_XML:
        return xml_print_data(out, root, options);
    case LYD_JSON:
        return json_print_data(out, root, options);
    default:
        LOGERR(LY_EINVAL, "Unknown output format.");
        return EXIT_FAILURE;
    }
}